

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CMultiBindingPoint<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CMultiBindingPoint<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  long lVar2;
  DIResult result;
  undefined1 local_330 [384];
  long local_1b0;
  DILogger local_1a8;
  
  local_330[0] = false;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_330 + 8));
  local_1b0 = 0;
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,10,this->_buffers);
  lVar2 = 10;
  do {
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffers[lVar2 + -10]);
    lVar1 = DrawIndirectBase::BindingPointCheck<glcts::(anonymous_namespace)::test_api::ES3>
                      (&this->super_DrawIndirectBase,this->_buffers[lVar2 + -10]);
    DIResult::sub_result(&local_1a8,(DIResult *)local_330,lVar1);
    DILogger::~DILogger(&local_1a8);
    lVar1 = local_1b0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x14);
  DILogger::~DILogger((DILogger *)local_330);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		const int buffNum = sizeof(_buffers) / sizeof(_buffers[0]);

		glGenBuffers(buffNum, _buffers);

		for (int i = 0; i < buffNum; ++i)
		{
			glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffers[i]);
			result.sub_result(BindingPointCheck<api>(_buffers[i]));
		}

		return result.code();
	}